

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGI_color_table(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGI_color_table != 0) {
    glad_glColorTableSGI = (PFNGLCOLORTABLESGIPROC)(*load)("glColorTableSGI");
    glad_glColorTableParameterfvSGI =
         (PFNGLCOLORTABLEPARAMETERFVSGIPROC)(*load)("glColorTableParameterfvSGI");
    glad_glColorTableParameterivSGI =
         (PFNGLCOLORTABLEPARAMETERIVSGIPROC)(*load)("glColorTableParameterivSGI");
    glad_glCopyColorTableSGI = (PFNGLCOPYCOLORTABLESGIPROC)(*load)("glCopyColorTableSGI");
    glad_glGetColorTableSGI = (PFNGLGETCOLORTABLESGIPROC)(*load)("glGetColorTableSGI");
    glad_glGetColorTableParameterfvSGI =
         (PFNGLGETCOLORTABLEPARAMETERFVSGIPROC)(*load)("glGetColorTableParameterfvSGI");
    glad_glGetColorTableParameterivSGI =
         (PFNGLGETCOLORTABLEPARAMETERIVSGIPROC)(*load)("glGetColorTableParameterivSGI");
  }
  return;
}

Assistant:

static void load_GL_SGI_color_table(GLADloadproc load) {
	if(!GLAD_GL_SGI_color_table) return;
	glad_glColorTableSGI = (PFNGLCOLORTABLESGIPROC)load("glColorTableSGI");
	glad_glColorTableParameterfvSGI = (PFNGLCOLORTABLEPARAMETERFVSGIPROC)load("glColorTableParameterfvSGI");
	glad_glColorTableParameterivSGI = (PFNGLCOLORTABLEPARAMETERIVSGIPROC)load("glColorTableParameterivSGI");
	glad_glCopyColorTableSGI = (PFNGLCOPYCOLORTABLESGIPROC)load("glCopyColorTableSGI");
	glad_glGetColorTableSGI = (PFNGLGETCOLORTABLESGIPROC)load("glGetColorTableSGI");
	glad_glGetColorTableParameterfvSGI = (PFNGLGETCOLORTABLEPARAMETERFVSGIPROC)load("glGetColorTableParameterfvSGI");
	glad_glGetColorTableParameterivSGI = (PFNGLGETCOLORTABLEPARAMETERIVSGIPROC)load("glGetColorTableParameterivSGI");
}